

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndCriteria.cpp
# Opt level: O2

bool __thiscall
QuantLib::EndCriteria::checkStationaryFunctionValue
          (EndCriteria *this,RealType fxOld,RealType fxNew,size_t *statStateIterations,Type *ecType)

{
  size_t sVar1;
  
  if (this->functionEpsilon_ <= ABS(fxNew - fxOld)) {
    *statStateIterations = 0;
  }
  else {
    sVar1 = *statStateIterations;
    *statStateIterations = sVar1 + 1;
    if (this->maxStationaryStateIterations_ < sVar1 + 1) {
      *ecType = StationaryFunctionValue;
      return true;
    }
  }
  return false;
}

Assistant:

bool EndCriteria::checkStationaryFunctionValue(
      const RealType fxOld, const RealType fxNew, size_t& statStateIterations,
      EndCriteria::Type& ecType) const {
    if (std::fabs(fxNew - fxOld) >= functionEpsilon_) {
      statStateIterations = 0;
      return false;
    }
    ++statStateIterations;
    if (statStateIterations <= maxStationaryStateIterations_) return false;
    ecType = StationaryFunctionValue;
    return true;
  }